

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

void Saig_RefManFindReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vPrios,Vec_Int_t *vReasons)

{
  Aig_Obj_t *pAVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  uint uVar7;
  Aig_Obj_t *pAVar8;
  uint uVar9;
  
LAB_0058d116:
  pAVar4 = pObj;
  if (pAVar4->TravId == p->nTravIds) {
    return;
  }
  pAVar4->TravId = p->nTravIds;
  uVar6 = (uint)*(ulong *)&pAVar4->field_0x18;
  if ((uVar6 & 7) == 2) {
    Vec_IntPush(vReasons,(pAVar4->field_0).CioId);
    return;
  }
  if ((uVar6 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x82,
                  "void Saig_RefManFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  pAVar1 = pAVar4->pFanin0;
  if ((*(ulong *)&pAVar4->field_0x18 & 8) == 0) goto code_r0x0058d15d;
  Saig_RefManFindReason_rec(p,(Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe),vPrios,vReasons);
  goto LAB_0058d216;
code_r0x0058d15d:
  uVar6 = (uint)pAVar1 & 1;
  pAVar5 = (Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe);
  uVar7 = *(uint *)&pAVar5->field_0x18 >> 3 & 1;
  pAVar8 = (Aig_Obj_t *)((ulong)pAVar4->pFanin1 & 0xfffffffffffffffe);
  uVar9 = (*(uint *)&pAVar8->field_0x18 >> 3 ^ (uint)pAVar4->pFanin1) & 1;
  if ((uVar6 != uVar7) && (uVar9 != 0)) {
    __assert_fail("!fPhase0 || !fPhase1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x8c,
                  "void Saig_RefManFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (((uVar6 != uVar7) || (pObj = pAVar5, uVar9 == 0)) &&
     ((uVar6 == uVar7 || (pObj = pAVar8, uVar9 != 0)))) {
    iVar3 = -1;
    iVar2 = -1;
    if (pAVar1 != (Aig_Obj_t *)0x0) {
      iVar2 = pAVar5->Id;
    }
    iVar2 = Vec_IntEntry(vPrios,iVar2);
    if (pAVar4->pFanin1 != (Aig_Obj_t *)0x0) {
      iVar3 = *(int *)(((ulong)pAVar4->pFanin1 & 0xfffffffffffffffe) + 0x24);
    }
    iVar3 = Vec_IntEntry(vPrios,iVar3);
    if (iVar3 < iVar2) {
LAB_0058d216:
      pObj = (Aig_Obj_t *)((ulong)pAVar4->pFanin1 & 0xfffffffffffffffe);
    }
    else {
      pObj = (Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe);
    }
  }
  goto LAB_0058d116;
}

Assistant:

void Saig_RefManFindReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vPrios, Vec_Int_t * vReasons )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vReasons, Aig_ObjCioId(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( pObj->fPhase )
    {
        Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
    }
    else
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        else if ( fPhase0 && !fPhase1 )
            Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        else 
        {
            int iPrio0 = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
            int iPrio1 = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
            if ( iPrio0 <= iPrio1 )
                Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
            else
                Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        }
    }
}